

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Strings.cc
# Opt level: O0

void phosg::print_data(FILE *stream,iovec *iovs,size_t num_iovs,uint64_t start_address,
                      iovec *prev_iovs,size_t num_prev_iovs,uint64_t flags)

{
  int iVar1;
  function<void_(const_void_*,_unsigned_long)> local_60;
  anon_class_8_1_6bf940be local_40;
  anon_class_8_1_6bf940be write_data;
  size_t num_prev_iovs_local;
  iovec *prev_iovs_local;
  uint64_t start_address_local;
  size_t num_iovs_local;
  iovec *iovs_local;
  FILE *stream_local;
  
  write_data.stream = (FILE **)num_prev_iovs;
  iovs_local = (iovec *)stream;
  if ((flags & 0x81) == 0) {
    iVar1 = fileno((FILE *)stream);
    iVar1 = isatty(iVar1);
    if (iVar1 == 0) {
      flags = flags | 0x80;
    }
    else {
      flags = flags | 1;
    }
  }
  local_40.stream = (FILE **)&iovs_local;
  ::std::function<void(void_const*,unsigned_long)>::
  function<phosg::print_data(_IO_FILE*,iovec_const*,unsigned_long,unsigned_long,iovec_const*,unsigned_long,unsigned_long)::__0&,void>
            ((function<void(void_const*,unsigned_long)> *)&local_60,&local_40);
  format_data(&local_60,iovs,num_iovs,start_address,prev_iovs,(size_t)write_data.stream,flags);
  ::std::function<void_(const_void_*,_unsigned_long)>::~function(&local_60);
  return;
}

Assistant:

void print_data(
    FILE* stream,
    const struct iovec* iovs,
    size_t num_iovs,
    uint64_t start_address,
    const struct iovec* prev_iovs,
    size_t num_prev_iovs,
    uint64_t flags) {
  if (!(flags & (PrintDataFlags::USE_COLOR | PrintDataFlags::DISABLE_COLOR))) {
    if (isatty(fileno(stream))) {
      flags |= PrintDataFlags::USE_COLOR;
    } else {
      flags |= PrintDataFlags::DISABLE_COLOR;
    }
  }
  auto write_data = [&](const void* data, size_t size) -> void {
    fwrite(data, size, 1, stream);
  };
  format_data(write_data, iovs, num_iovs, start_address, prev_iovs, num_prev_iovs, flags);
}